

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86.cpp
# Opt level: O0

int __thiscall ncnn::DeformableConv2D_x86::create_pipeline(DeformableConv2D_x86 *this,Option *opt)

{
  long lVar1;
  ulong uVar2;
  Layer *pLVar3;
  void **ppvVar4;
  undefined8 *puVar5;
  byte *in_RSI;
  long *in_RDI;
  Mat weights_1 [1];
  Mat weights [2];
  float *k00;
  int i;
  int k;
  int p;
  float *g00;
  int q;
  Mat weight_data_r2;
  Mat tmp;
  ParamDict pd;
  int maxk;
  int out_elempack;
  int elempack;
  int num_input;
  int kernel_size;
  Mat *m;
  undefined4 in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff904;
  Allocator *in_stack_fffffffffffff908;
  size_t in_stack_fffffffffffff910;
  long *plVar6;
  Mat *in_stack_fffffffffffff918;
  long *plVar7;
  Mat *in_stack_fffffffffffff920;
  void **local_698;
  void **local_660;
  Option *in_stack_fffffffffffff9b0;
  Mat *in_stack_fffffffffffff9b8;
  int in_stack_fffffffffffff9c4;
  undefined8 in_stack_fffffffffffff9e0;
  void **ppvVar8;
  undefined8 in_stack_fffffffffffff9e8;
  void **ppvVar9;
  Mat *in_stack_fffffffffffff9f0;
  Mat *in_stack_fffffffffffff9f8;
  int _c;
  undefined8 in_stack_fffffffffffffa00;
  Mat *in_stack_fffffffffffffa08;
  void **local_5d0;
  undefined1 local_578 [16];
  void *local_568;
  int in_stack_fffffffffffffaa0;
  undefined4 uStack_55c;
  int *piVar10;
  int in_stack_fffffffffffffaa8;
  long *local_548;
  void *pvStack_520;
  undefined1 local_518 [16];
  void *local_508;
  int *local_500;
  void *local_4f8;
  undefined4 local_4f0;
  long *local_4e8;
  undefined4 local_4e0;
  undefined4 local_4dc;
  undefined4 local_4d8;
  undefined4 local_4d4;
  undefined4 local_4d0;
  void *local_4c8;
  void *local_4c0;
  int *local_4b8;
  long *local_4a0;
  void *local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined4 local_460;
  long *local_458;
  undefined4 local_450;
  undefined4 local_44c;
  undefined4 local_448;
  undefined4 local_444;
  undefined4 local_440;
  undefined8 local_438;
  void *local_430;
  int local_424;
  int local_420;
  int local_41c;
  undefined4 *local_418;
  int local_40c;
  void *local_408;
  int *local_400;
  long local_3f8;
  undefined4 local_3f0;
  long *local_3e8;
  undefined4 local_3e0;
  int local_3dc;
  int local_3d8;
  undefined4 local_3d4;
  undefined4 local_3d0;
  long local_3c8;
  void *local_3c0;
  int *local_3b8;
  long local_3b0;
  undefined4 local_3a8;
  long *local_3a0;
  undefined4 local_398;
  int local_394;
  undefined4 local_390;
  undefined4 local_38c;
  undefined4 local_388;
  undefined8 local_380;
  ParamDict local_368;
  int local_354;
  int local_350;
  int local_34c;
  int local_348;
  int local_344;
  byte *local_340;
  void **local_330;
  void **local_328;
  void **local_320;
  int local_314;
  void **local_310;
  int local_304;
  void **local_300;
  undefined1 local_2f5;
  int local_2f4;
  void **local_2f0;
  void **local_2e8;
  void **local_2d8;
  void **local_2c8;
  void **local_2b0;
  void **local_298;
  void **local_288;
  int local_278;
  undefined4 local_274;
  long *local_270;
  long *local_268;
  long *local_260;
  int local_258;
  undefined4 local_254;
  void **local_250;
  void **local_248;
  void **local_240;
  int local_238;
  undefined4 local_234;
  void **local_230;
  void **local_228;
  void **local_220;
  int local_218;
  undefined4 local_214;
  void **local_210;
  void **local_208;
  void **local_200;
  int local_1f8;
  undefined4 local_1f4;
  void **local_1f0;
  int local_1e8;
  undefined4 local_1e4;
  void **local_1e0;
  int local_1d8;
  undefined4 local_1d4;
  void **local_1d0;
  int local_1c8;
  undefined4 local_1c4;
  long *local_1c0;
  int local_1a8;
  undefined4 local_1a4;
  void **local_1a0;
  int local_188;
  undefined4 local_184;
  void **local_180;
  int local_158;
  undefined4 local_154;
  void **local_150;
  int local_128;
  undefined4 local_124;
  void **local_120;
  void **local_100;
  int local_e8;
  undefined4 local_e4;
  undefined8 *local_e0;
  void *local_c0;
  void **local_a8;
  undefined4 local_9c;
  long local_98;
  void *local_90;
  void *local_58;
  void *local_40;
  void *local_30;
  void *local_20;
  
  local_340 = in_RSI;
  pLVar3 = create_activation_layer
                     (in_stack_fffffffffffff9c4,in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0)
  ;
  in_RDI[1] = (long)pLVar3;
  local_344 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
  uVar2 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100) / (long)local_344;
  local_348 = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                   (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
  local_34c = 1;
  local_350 = 1;
  if ((local_340[0x27] & 1) != 0) {
    local_34c = 1;
    if (local_348 % 4 == 0) {
      local_34c = 4;
    }
    local_350 = 1;
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0) {
      local_350 = 4;
    }
  }
  if ((local_340[0x1d] & 1) == 0) {
    if ((local_34c == 1) && (local_350 == 1)) {
      lVar1 = *(long *)(*in_RDI + -0x18);
      local_270 = (long *)((long)in_RDI + lVar1 + 0x150);
      plVar6 = in_RDI + 2;
      local_268 = plVar6;
      local_260 = plVar6;
      if (plVar6 != local_270) {
        if (*(long *)((long)in_RDI + lVar1 + 0x158) != 0) {
          piVar10 = *(int **)((long)in_RDI + lVar1 + 0x158);
          local_274 = 1;
          LOCK();
          local_278 = *piVar10;
          *piVar10 = *piVar10 + 1;
          UNLOCK();
        }
        plVar7 = plVar6;
        local_1c0 = plVar6;
        if (in_RDI[3] != 0) {
          piVar10 = (int *)in_RDI[3];
          local_1c4 = 0xffffffff;
          LOCK();
          local_1c8 = *piVar10;
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (local_1c8 == 1) {
            if (in_RDI[6] == 0) {
              local_20 = (void *)*plVar6;
              if (local_20 != (void *)0x0) {
                free(local_20);
              }
            }
            else {
              (**(code **)(*(long *)in_RDI[6] + 0x18))((long *)in_RDI[6],*plVar6);
            }
          }
        }
        *plVar6 = 0;
        plVar6[2] = 0;
        *(undefined4 *)(plVar6 + 3) = 0;
        *(undefined4 *)(plVar6 + 5) = 0;
        *(undefined4 *)((long)plVar6 + 0x2c) = 0;
        *(undefined4 *)(plVar6 + 6) = 0;
        *(undefined4 *)((long)plVar6 + 0x34) = 0;
        *(undefined4 *)(plVar6 + 7) = 0;
        plVar6[8] = 0;
        plVar6[1] = 0;
        *plVar7 = *local_270;
        plVar7[1] = local_270[1];
        plVar7[2] = local_270[2];
        *(int *)(plVar7 + 3) = (int)local_270[3];
        plVar7[4] = local_270[4];
        *(int *)(plVar7 + 5) = (int)local_270[5];
        *(undefined4 *)((long)plVar7 + 0x2c) = *(undefined4 *)((long)local_270 + 0x2c);
        *(int *)(plVar7 + 6) = (int)local_270[6];
        *(undefined4 *)((long)plVar7 + 0x34) = *(undefined4 *)((long)local_270 + 0x34);
        *(int *)(plVar7 + 7) = (int)local_270[7];
        plVar7[8] = local_270[8];
        local_260 = plVar7;
      }
    }
    else {
      deformableconv2d_transform_kernel_packed_sse
                (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
                 (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20),(int)in_stack_fffffffffffff9e8,
                 (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20),(int)in_stack_fffffffffffff9e0,
                 in_stack_fffffffffffffaa0,in_stack_fffffffffffffaa8);
    }
  }
  else {
    local_354 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
                *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
    pLVar3 = create_layer((int)((ulong)in_stack_fffffffffffff908 >> 0x20));
    _c = (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
    in_RDI[0xb] = (long)pLVar3;
    ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff920);
    ParamDict::set(&local_368,2,0);
    ParamDict::set(&local_368,3,0);
    ParamDict::set(&local_368,4,1);
    ParamDict::set(&local_368,5,0);
    ParamDict::set(&local_368,6,1);
    ParamDict::set(&local_368,7,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
    ParamDict::set(&local_368,8,0);
    ParamDict::set(&local_368,9,local_354 * local_348);
    ParamDict::set(&local_368,10,
                   -(uint)(*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xfc) == 0) | 1);
    ParamDict::set(&local_368,0xb,1);
    (**(code **)(*(long *)in_RDI[0xb] + 0x10))((long *)in_RDI[0xb],&local_368);
    local_330 = &local_3c0;
    local_3c0 = (void *)0x0;
    local_3b8 = (int *)0x0;
    local_3b0 = 0;
    local_3a8 = 0;
    local_3a0 = (long *)0x0;
    local_398 = 0;
    local_394 = 0;
    local_390 = 0;
    local_38c = 0;
    local_388 = 0;
    local_380 = 0;
    Mat::reshape(in_stack_fffffffffffffa08,(int)((ulong)in_stack_fffffffffffffa00 >> 0x20),
                 (int)in_stack_fffffffffffffa00,_c,(Allocator *)in_stack_fffffffffffff9f0);
    Mat::create(in_stack_fffffffffffff920,(int)((ulong)in_stack_fffffffffffff918 >> 0x20),
                (int)in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff908);
    for (local_40c = 0; local_40c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_40c = local_40c + 1) {
      local_300 = &local_3c0;
      local_304 = local_40c;
      local_418 = (undefined4 *)((long)local_3c0 + (long)local_394 * (long)local_40c * local_3b0);
      for (local_41c = 0; local_41c + local_34c + -1 < local_348; local_41c = local_34c + local_41c)
      {
        for (local_420 = 0; local_420 < local_354; local_420 = local_420 + 1) {
          for (local_424 = 0; local_424 < local_34c; local_424 = local_424 + 1) {
            local_2e8 = &local_478;
            local_2f0 = &local_408;
            local_c0 = (void *)((long)local_408 + local_3c8 * local_40c * local_3f8);
            local_a8 = &local_478;
            local_458 = local_3e8;
            local_98 = (long)local_3dc * (long)local_3d8 * local_3f8;
            local_9c = 0x10;
            local_2f4 = local_40c;
            local_2f5 = 1;
            local_314 = local_41c + local_424;
            local_310 = &local_478;
            local_430 = (void *)((long)local_c0 + (long)local_3dc * (long)local_314 * local_3f8);
            local_2d8 = &local_478;
            local_478 = (void *)0x0;
            local_468 = 0;
            local_460 = 0;
            local_450 = 0;
            local_44c = 0;
            local_448 = 0;
            local_444 = 0;
            local_440 = 0;
            local_438 = 0;
            local_470 = 0;
            *local_418 = *(undefined4 *)((long)local_430 + (long)local_420 * 4);
            local_418 = local_418 + 1;
            local_100 = local_2d8;
          }
        }
      }
    }
    local_2c8 = &local_408;
    local_120 = local_2c8;
    if (local_400 != (int *)0x0) {
      local_124 = 0xffffffff;
      LOCK();
      local_128 = *local_400;
      *local_400 = *local_400 + -1;
      UNLOCK();
      if (local_128 == 1) {
        if (local_3e8 == (long *)0x0) {
          if (local_408 != (void *)0x0) {
            free(local_408);
          }
        }
        else {
          (**(code **)(*local_3e8 + 0x18))(local_3e8,local_408);
        }
      }
    }
    local_408 = (void *)0x0;
    local_3f8 = 0;
    local_3f0 = 0;
    local_3e0 = 0;
    local_3dc = 0;
    local_3d8 = 0;
    local_3d4 = 0;
    local_3d0 = 0;
    local_3c8 = 0;
    local_400 = (int *)0x0;
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xfc) == 0) {
      local_660 = &local_568;
      do {
        local_320 = local_660;
        *local_660 = (void *)0x0;
        local_660[1] = (void *)0x0;
        local_660[2] = (void *)0x0;
        *(undefined4 *)(local_660 + 3) = 0;
        local_660[4] = (void *)0x0;
        *(undefined4 *)(local_660 + 5) = 0;
        *(undefined4 *)((long)local_660 + 0x2c) = 0;
        *(undefined4 *)(local_660 + 6) = 0;
        *(undefined4 *)((long)local_660 + 0x34) = 0;
        *(undefined4 *)(local_660 + 7) = 0;
        local_660[8] = (void *)0x0;
        local_660 = local_660 + 9;
      } while (local_660 != &pvStack_520);
      local_250 = &local_3c0;
      local_248 = &local_568;
      if (&local_568 != local_250) {
        if (local_3b8 != (int *)0x0) {
          local_254 = 1;
          LOCK();
          local_258 = *local_3b8;
          *local_3b8 = *local_3b8 + 1;
          UNLOCK();
        }
        local_1d0 = &local_568;
        if (piVar10 != (int *)0x0) {
          local_1d4 = 0xffffffff;
          LOCK();
          local_1d8 = *piVar10;
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (local_1d8 == 1) {
            if (local_548 == (long *)0x0) {
              if (local_568 != (void *)0x0) {
                free(local_568);
              }
            }
            else {
              (**(code **)(*local_548 + 0x18))(local_548,local_568);
            }
          }
        }
        local_568 = *local_250;
      }
      plVar6 = (long *)in_RDI[0xb];
      local_240 = &local_568;
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
      (**(code **)(*plVar6 + 0x18))(plVar6,local_578);
      ModelBinFromMatArray::~ModelBinFromMatArray
                ((ModelBinFromMatArray *)
                 CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
      local_698 = &pvStack_520;
      do {
        ppvVar8 = local_698 + -9;
        local_298 = ppvVar8;
        local_180 = ppvVar8;
        if (local_698[-8] != (void *)0x0) {
          piVar10 = (int *)local_698[-8];
          local_184 = 0xffffffff;
          LOCK();
          local_188 = *piVar10;
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (local_188 == 1) {
            if (local_698[-5] == (void *)0x0) {
              local_40 = *ppvVar8;
              if (local_40 != (void *)0x0) {
                free(local_40);
              }
            }
            else {
              (**(code **)(*local_698[-5] + 0x18))(local_698[-5],*ppvVar8);
            }
          }
        }
        *ppvVar8 = (void *)0x0;
        local_698[-7] = (void *)0x0;
        *(undefined4 *)(local_698 + -6) = 0;
        *(undefined4 *)(local_698 + -4) = 0;
        *(undefined4 *)((long)local_698 + -0x1c) = 0;
        *(undefined4 *)(local_698 + -3) = 0;
        *(undefined4 *)((long)local_698 + -0x14) = 0;
        *(undefined4 *)(local_698 + -2) = 0;
        local_698[-1] = (void *)0x0;
        local_698[-8] = (void *)0x0;
        local_698 = ppvVar8;
      } while (ppvVar8 != &local_568);
    }
    else {
      local_5d0 = &local_508;
      do {
        local_328 = local_5d0;
        *local_5d0 = (void *)0x0;
        local_5d0[1] = (void *)0x0;
        local_5d0[2] = (void *)0x0;
        *(undefined4 *)(local_5d0 + 3) = 0;
        local_5d0[4] = (void *)0x0;
        *(undefined4 *)(local_5d0 + 5) = 0;
        *(undefined4 *)((long)local_5d0 + 0x2c) = 0;
        *(undefined4 *)(local_5d0 + 6) = 0;
        *(undefined4 *)((long)local_5d0 + 0x34) = 0;
        *(undefined4 *)(local_5d0 + 7) = 0;
        local_5d0[8] = (void *)0x0;
        local_5d0 = local_5d0 + 9;
      } while (local_5d0 != &local_478);
      local_210 = &local_3c0;
      local_208 = &local_508;
      if (&local_508 != local_210) {
        if (local_3b8 != (int *)0x0) {
          local_214 = 1;
          LOCK();
          local_218 = *local_3b8;
          *local_3b8 = *local_3b8 + 1;
          UNLOCK();
        }
        ppvVar8 = &local_508;
        local_1f0 = &local_508;
        if (local_500 != (int *)0x0) {
          local_1f4 = 0xffffffff;
          LOCK();
          local_1f8 = *local_500;
          *local_500 = *local_500 + -1;
          UNLOCK();
          if (local_1f8 == 1) {
            if (local_4e8 == (long *)0x0) {
              if (local_508 != (void *)0x0) {
                free(local_508);
              }
            }
            else {
              (**(code **)(*local_4e8 + 0x18))(local_4e8,local_508);
            }
          }
        }
        *ppvVar8 = (void *)0x0;
        ppvVar8[2] = (void *)0x0;
        *(undefined4 *)(ppvVar8 + 3) = 0;
        *(undefined4 *)(ppvVar8 + 5) = 0;
        *(undefined4 *)((long)ppvVar8 + 0x2c) = 0;
        *(undefined4 *)(ppvVar8 + 6) = 0;
        *(undefined4 *)((long)ppvVar8 + 0x34) = 0;
        *(undefined4 *)(ppvVar8 + 7) = 0;
        ppvVar8[8] = (void *)0x0;
        ppvVar8[1] = (void *)0x0;
        local_508 = *local_210;
        local_500 = (int *)local_210[1];
        local_4f8 = local_210[2];
        local_4f0 = *(undefined4 *)(local_210 + 3);
        local_4e8 = (long *)local_210[4];
        local_4e0 = *(undefined4 *)(local_210 + 5);
        local_4dc = *(undefined4 *)((long)local_210 + 0x2c);
        local_4d8 = *(undefined4 *)(local_210 + 6);
        local_4d4 = *(undefined4 *)((long)local_210 + 0x34);
        local_4d0 = *(undefined4 *)(local_210 + 7);
        local_4c8 = local_210[8];
      }
      lVar1 = *(long *)(*in_RDI + -0x18);
      local_230 = (void **)((long)in_RDI + lVar1 + 0x198);
      ppvVar8 = &local_4c0;
      local_228 = ppvVar8;
      local_200 = &local_508;
      if (ppvVar8 != local_230) {
        if (*(long *)((long)in_RDI + lVar1 + 0x1a0) != 0) {
          piVar10 = *(int **)((long)in_RDI + lVar1 + 0x1a0);
          local_234 = 1;
          LOCK();
          local_238 = *piVar10;
          *piVar10 = *piVar10 + 1;
          UNLOCK();
        }
        ppvVar9 = ppvVar8;
        local_1e0 = ppvVar8;
        if (local_4b8 != (int *)0x0) {
          local_1e4 = 0xffffffff;
          LOCK();
          local_1e8 = *local_4b8;
          *local_4b8 = *local_4b8 + -1;
          UNLOCK();
          if (local_1e8 == 1) {
            if (local_4a0 == (long *)0x0) {
              if (local_4c0 != (void *)0x0) {
                free(local_4c0);
              }
            }
            else {
              (**(code **)(*local_4a0 + 0x18))(local_4a0,local_4c0);
            }
          }
        }
        *ppvVar8 = (void *)0x0;
        ppvVar8[2] = (void *)0x0;
        *(undefined4 *)(ppvVar8 + 3) = 0;
        *(undefined4 *)(ppvVar8 + 5) = 0;
        *(undefined4 *)((long)ppvVar8 + 0x2c) = 0;
        *(undefined4 *)(ppvVar8 + 6) = 0;
        *(undefined4 *)((long)ppvVar8 + 0x34) = 0;
        *(undefined4 *)(ppvVar8 + 7) = 0;
        ppvVar8[8] = (void *)0x0;
        ppvVar8[1] = (void *)0x0;
        *ppvVar9 = *local_230;
        ppvVar9[1] = local_230[1];
        ppvVar9[2] = local_230[2];
        *(undefined4 *)(ppvVar9 + 3) = *(undefined4 *)(local_230 + 3);
        ppvVar9[4] = local_230[4];
        *(undefined4 *)(ppvVar9 + 5) = *(undefined4 *)(local_230 + 5);
        *(undefined4 *)((long)ppvVar9 + 0x2c) = *(undefined4 *)((long)local_230 + 0x2c);
        *(undefined4 *)(ppvVar9 + 6) = *(undefined4 *)(local_230 + 6);
        *(undefined4 *)((long)ppvVar9 + 0x34) = *(undefined4 *)((long)local_230 + 0x34);
        *(undefined4 *)(ppvVar9 + 7) = *(undefined4 *)(local_230 + 7);
        ppvVar9[8] = local_230[8];
        ppvVar8 = ppvVar9;
      }
      plVar6 = (long *)in_RDI[0xb];
      local_220 = ppvVar8;
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
      (**(code **)(*plVar6 + 0x18))(plVar6,local_518);
      ModelBinFromMatArray::~ModelBinFromMatArray
                ((ModelBinFromMatArray *)
                 CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
      ppvVar8 = &local_508;
      ppvVar9 = &local_478;
      do {
        ppvVar4 = ppvVar9 + -9;
        local_2b0 = ppvVar4;
        local_150 = ppvVar4;
        if (ppvVar9[-8] != (void *)0x0) {
          piVar10 = (int *)ppvVar9[-8];
          local_154 = 0xffffffff;
          LOCK();
          local_158 = *piVar10;
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (local_158 == 1) {
            if (ppvVar9[-5] == (void *)0x0) {
              local_58 = *ppvVar4;
              if (local_58 != (void *)0x0) {
                free(local_58);
              }
            }
            else {
              (**(code **)(*ppvVar9[-5] + 0x18))(ppvVar9[-5],*ppvVar4);
            }
          }
        }
        *ppvVar4 = (void *)0x0;
        ppvVar9[-7] = (void *)0x0;
        *(undefined4 *)(ppvVar9 + -6) = 0;
        *(undefined4 *)(ppvVar9 + -4) = 0;
        *(undefined4 *)((long)ppvVar9 + -0x1c) = 0;
        *(undefined4 *)(ppvVar9 + -3) = 0;
        *(undefined4 *)((long)ppvVar9 + -0x14) = 0;
        *(undefined4 *)(ppvVar9 + -2) = 0;
        ppvVar9[-1] = (void *)0x0;
        ppvVar9[-8] = (void *)0x0;
        ppvVar9 = ppvVar4;
      } while (ppvVar4 != ppvVar8);
    }
    (**(code **)(*(long *)in_RDI[0xb] + 0x20))((long *)in_RDI[0xb],local_340);
    local_288 = &local_3c0;
    local_1a0 = local_288;
    if (local_3b8 != (int *)0x0) {
      local_1a4 = 0xffffffff;
      LOCK();
      local_1a8 = *local_3b8;
      *local_3b8 = *local_3b8 + -1;
      UNLOCK();
      if (local_1a8 == 1) {
        if (local_3a0 == (long *)0x0) {
          local_30 = local_3c0;
          if (local_3c0 != (void *)0x0) {
            free(local_3c0);
          }
        }
        else {
          (**(code **)(*local_3a0 + 0x18))(local_3a0,local_3c0);
        }
      }
    }
    local_3c0 = (void *)0x0;
    local_3b0 = 0;
    local_3a8 = 0;
    local_398 = 0;
    local_394 = 0;
    local_390 = 0;
    local_38c = 0;
    local_388 = 0;
    local_380 = 0;
    local_3b8 = (int *)0x0;
    ParamDict::~ParamDict
              ((ParamDict *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
  }
  if ((*local_340 & 1) != 0) {
    lVar1 = *(long *)(*in_RDI + -0x18);
    puVar5 = (undefined8 *)((long)in_RDI + lVar1 + 0x150);
    if (*(long *)((long)in_RDI + lVar1 + 0x158) != 0) {
      piVar10 = *(int **)((long)in_RDI + lVar1 + 0x158);
      local_e4 = 0xffffffff;
      LOCK();
      local_e8 = *piVar10;
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (local_e8 == 1) {
        local_e0 = puVar5;
        if (*(long *)((long)in_RDI + lVar1 + 0x170) == 0) {
          local_90 = (void *)*puVar5;
          if (local_90 != (void *)0x0) {
            free(local_90);
          }
        }
        else {
          plVar6 = *(long **)((long)in_RDI + lVar1 + 0x170);
          (**(code **)(*plVar6 + 0x18))(plVar6,*puVar5);
        }
      }
    }
    *puVar5 = 0;
    puVar5[2] = 0;
    *(undefined4 *)(puVar5 + 3) = 0;
    *(undefined4 *)(puVar5 + 5) = 0;
    *(undefined4 *)((long)puVar5 + 0x2c) = 0;
    *(undefined4 *)(puVar5 + 6) = 0;
    *(undefined4 *)((long)puVar5 + 0x34) = 0;
    *(undefined4 *)(puVar5 + 7) = 0;
    puVar5[8] = 0;
    puVar5[1] = 0;
  }
  return 0;
}

Assistant:

int DeformableConv2D_x86::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 0);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 1);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, 1);                   // constantC
        pd.set(7, num_output);          // M = outch
        pd.set(8, 0);                   // N = size
        pd.set(9, maxk * num_input);    // K = maxk*inch
        pd.set(10, bias_term ? 1 : -1); // constant_broadcast_type_C = (M)
        pd.set(11, 1);                  // output_N1M

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-inch/pa-outch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_input, num_output);

            for (int q = 0; q < num_output; q += 1)
            {
                float* g00 = tmp.row(q);

                for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q).row(p + i);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = tmp;
            weights[1] = bias_data;

            gemm->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = tmp;

            gemm->load_model(ModelBinFromMatArray(weights));
        }

        gemm->create_pipeline(opt);
    }
    else if (elempack == 1 && out_elempack == 1)
    {
        weight_data_tm = weight_data;
    }
    else
    {
        deformableconv2d_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}